

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O0

void __thiscall Fl_Tree::show_item(Fl_Tree *this,Fl_Tree_Item *item,int yoff)

{
  int iVar1;
  int iVar2;
  double dVar3;
  Fl_Tree_Item *local_30;
  int local_20;
  int newval;
  int yoff_local;
  Fl_Tree_Item *item_local;
  Fl_Tree *this_local;
  
  local_30 = item;
  if (item == (Fl_Tree_Item *)0x0) {
    local_30 = first(this);
  }
  if (local_30 != (Fl_Tree_Item *)0x0) {
    iVar1 = Fl_Tree_Item::y(local_30);
    iVar2 = Fl_Widget::y((Fl_Widget *)this);
    local_20 = Fl_Scrollbar::value(this->_vscroll);
    local_20 = ((iVar1 - iVar2) - yoff) + local_20;
    dVar3 = Fl_Valuator::minimum((Fl_Valuator *)this->_vscroll);
    if ((double)local_20 < dVar3) {
      dVar3 = Fl_Valuator::minimum((Fl_Valuator *)this->_vscroll);
      local_20 = (int)dVar3;
    }
    dVar3 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
    if (dVar3 < (double)local_20) {
      dVar3 = Fl_Valuator::maximum((Fl_Valuator *)this->_vscroll);
      local_20 = (int)dVar3;
    }
    Fl_Scrollbar::value(this->_vscroll,local_20);
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void Fl_Tree::show_item(Fl_Tree_Item *item, int yoff) {
  item = item ? item : first();
  if (!item) return;
  int newval = item->y() - y() - yoff + (int)_vscroll->value();
  if ( newval < _vscroll->minimum() ) newval = (int)_vscroll->minimum();
  if ( newval > _vscroll->maximum() ) newval = (int)_vscroll->maximum();
  _vscroll->value(newval);
  redraw();
}